

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printers.cpp
# Opt level: O1

void printSortedEvents(istream *input,ostream *output,string *format,string *dateFormat)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar3;
  pointer ppVar4;
  pointer ppVar5;
  Event *event;
  long lVar6;
  Pair *p;
  pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar7;
  initializer_list<unsigned_long> __l;
  initializer_list<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_> __l_00;
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  buffer;
  IstreamEntryStream entryStream;
  PrettyPrinter pp;
  EventStream eventStream;
  ostringstream stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_348;
  ostream *local_328;
  string local_320;
  string local_300;
  IstreamEntryStream local_2e0;
  PrettyPrinter local_2b8;
  EventStream local_268;
  undefined1 local_1a8 [8];
  pointer pEStack_1a0;
  pointer local_198;
  ios_base local_138 [264];
  
  local_328 = output;
  binlog::IstreamEntryStream::IstreamEntryStream(&local_2e0,input);
  local_1a8 = (undefined1  [8])0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)local_1a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_268,__l,
             (allocator_type *)&local_2b8);
  local_1a8 = (undefined1  [8])0x0;
  pEStack_1a0 = (pointer)0x0;
  local_198 = (pointer)0x0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_1a8;
  std::
  vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
  ::vector(&local_268._eventSources._segments,__l_00,(allocator_type *)&local_2b8);
  std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>::~vector
            ((vector<binlog::EventSource,_std::allocator<binlog::EventSource>_> *)local_1a8);
  local_268._writerProp.name._M_dataplus._M_p = (pointer)&local_268._writerProp.name.field_2;
  local_268._writerProp.id = 0;
  local_268._writerProp.name._M_string_length = 0;
  local_268._writerProp.name.field_2._M_local_buf[0] = '\0';
  local_268._clockSync.tzName._M_dataplus._M_p = (pointer)&local_268._clockSync.tzName.field_2;
  local_268._writerProp.batchSize = 0;
  local_268._clockSync.clockValue = 0;
  local_268._clockSync.clockFrequency = 0;
  local_268._clockSync.nsSinceEpoch = 0;
  local_268._clockSync.tzOffset = 0;
  local_268._clockSync.tzName._M_string_length = 0;
  local_268._clockSync.tzName.field_2._M_local_buf[0] = '\0';
  local_268._event.source = (EventSource *)0x0;
  local_268._event.clockValue = 0;
  local_268._event.arguments._begin = (char *)0x0;
  local_268._event.arguments._end = (char *)0x0;
  pcVar2 = (format->_M_dataplus)._M_p;
  local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,pcVar2,pcVar2 + format->_M_string_length);
  pcVar2 = (dateFormat->_M_dataplus)._M_p;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_320,pcVar2,pcVar2 + dateFormat->_M_string_length);
  binlog::PrettyPrinter::PrettyPrinter(&local_2b8,&local_300,&local_320);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != &local_300.field_2) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  local_348.
  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_348.
  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)0x0;
  local_348.
  super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  paVar1 = &local_368.field_2;
  do {
    event = binlog::EventStream::nextEvent(&local_268,&local_2e0.super_EntryStream);
    if (event == (Event *)0x0) break;
    local_368._M_string_length = 0;
    local_368.field_2._M_local_buf[0] = '\0';
    local_368._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::stringbuf::str((string *)&pEStack_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,
                      CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                               local_368.field_2._M_local_buf[0]) + 1);
    }
    binlog::PrettyPrinter::printEvent
              (&local_2b8,(ostream *)local_1a8,event,&local_268._writerProp,&local_268._clockSync);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
    ::emplace_back<unsigned_long_const&,std::__cxx11::string>
              ((vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>
                *)&local_348,&event->clockValue,&local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,
                      CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                               local_368.field_2._M_local_buf[0]) + 1);
    }
  } while (event != (Event *)0x0);
  ppVar5 = local_348.
           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppVar4 = local_348.
           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar7 = local_348.
           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar3 = local_348.
           super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_348.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_348.
      super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    lVar6 = ((long)local_348.
                   super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_348.
                   super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_368,
                        (__normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         )local_348.
                          super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                        (lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
    if (CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,local_368.field_2._M_local_buf[0]) ==
        0) {
      std::
      __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,std::__cxx11::string>*,std::vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>>,__gnu_cxx::__ops::_Iter_comp_iter<printSortedEvents(std::istream&,std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>>
                (ppVar4,ppVar5);
    }
    else {
      std::
      __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,std::__cxx11::string>*,std::vector<std::pair<unsigned_long,std::__cxx11::string>,std::allocator<std::pair<unsigned_long,std::__cxx11::string>>>>,std::pair<unsigned_long,std::__cxx11::string>*,long,__gnu_cxx::__ops::_Iter_comp_iter<printSortedEvents(std::istream&,std::ostream&,std::__cxx11::string_const&,std::__cxx11::string_const&)::__0>>
                (ppVar4,ppVar5,
                 CONCAT71(local_368.field_2._M_allocated_capacity._1_7_,
                          local_368.field_2._M_local_buf[0]),local_368._M_string_length);
    }
    std::
    _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Temporary_buffer
              ((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_368);
    ppVar7 = local_348.
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar3 = local_348.
             super__Vector_base<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>
              (local_328,(ppVar7->second)._M_dataplus._M_p,(ppVar7->second)._M_string_length);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::
  vector<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_348);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._timeFormat._M_dataplus._M_p != &local_2b8._timeFormat.field_2) {
    operator_delete(local_2b8._timeFormat._M_dataplus._M_p,
                    local_2b8._timeFormat.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._eventFormat._M_dataplus._M_p != &local_2b8._eventFormat.field_2) {
    operator_delete(local_2b8._eventFormat._M_dataplus._M_p,
                    local_2b8._eventFormat.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._clockSync.tzName._M_dataplus._M_p != &local_268._clockSync.tzName.field_2) {
    operator_delete(local_268._clockSync.tzName._M_dataplus._M_p,
                    CONCAT71(local_268._clockSync.tzName.field_2._M_allocated_capacity._1_7_,
                             local_268._clockSync.tzName.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._writerProp.name._M_dataplus._M_p != &local_268._writerProp.name.field_2) {
    operator_delete(local_268._writerProp.name._M_dataplus._M_p,
                    CONCAT71(local_268._writerProp.name.field_2._M_allocated_capacity._1_7_,
                             local_268._writerProp.name.field_2._M_local_buf[0]) + 1);
  }
  std::
  vector<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
  ::~vector(&local_268._eventSources._segments);
  if (local_268._eventSources._offsets.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268._eventSources._offsets.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268._eventSources._offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268._eventSources._offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_2e0.super_EntryStream._vptr_EntryStream = (_func_int **)&PTR__IstreamEntryStream_0010fcf8;
  if (local_2e0._buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0._buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e0._buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0._buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void printSortedEvents(std::istream& input, std::ostream& output, const std::string& format, const std::string& dateFormat)
{
  binlog::IstreamEntryStream entryStream(input);
  binlog::EventStream eventStream;
  binlog::PrettyPrinter pp(format, dateFormat);

  using Pair = std::pair<std::uint64_t /* clock */, std::string /* pretty printed event */>;
  std::vector<Pair> buffer;
  std::ostringstream stream;

  // buffer every event in input
  while (const binlog::Event* event = eventStream.nextEvent(entryStream))
  {
    stream.str({}); // reset stream
    pp.printEvent(stream, *event, eventStream.writerProp(), eventStream.clockSync());
    buffer.emplace_back(event->clockValue, stream.str());
  }

  // sort and print the the buffer
  const auto cmpClock = [](const Pair& p1, const Pair& p2) { return p1.first < p2.first; };
  std::stable_sort(buffer.begin(), buffer.end(), cmpClock);
  for (const Pair& p : buffer)
  {
    output << p.second;
  }
}